

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack26_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0x3ffffff;
  out[1] = uVar1 >> 0x1a;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x1a | (uVar2 & 0xfffff) << 6;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x14;
  out[2] = uVar2 >> 0x14 | (uVar1 & 0x3fff) << 0xc;
  out[3] = uVar1 >> 0xe;
  uVar2 = in[3];
  out[3] = uVar1 >> 0xe | (uVar2 & 0xff) << 0x12;
  out[4] = uVar2 >> 8;
  uVar1 = in[4];
  out[4] = uVar2 >> 8 | (uVar1 & 3) << 0x18;
  out[5] = uVar1 >> 2 & 0x3ffffff;
  out[6] = uVar1 >> 0x1c;
  uVar2 = in[5];
  uVar3 = in[6];
  out[6] = uVar1 >> 0x1c | (uVar2 & 0x3fffff) << 4;
  out[7] = uVar2 >> 0x16;
  out[7] = uVar2 >> 0x16 | (uVar3 & 0xffff) << 10;
  uVar1 = in[7];
  out[8] = uVar3 >> 0x10;
  out[8] = uVar3 >> 0x10 | (uVar1 & 0x3ff) << 0x10;
  out[9] = uVar1 >> 10;
  uVar2 = in[8];
  out[9] = uVar1 >> 10 | (uVar2 & 0xf) << 0x16;
  out[10] = uVar2 >> 4 & 0x3ffffff;
  out[0xb] = uVar2 >> 0x1e;
  uVar1 = in[9];
  out[0xb] = uVar2 >> 0x1e | (uVar1 & 0xffffff) << 2;
  out[0xc] = uVar1 >> 0x18;
  uVar2 = in[10];
  out[0xc] = uVar1 >> 0x18 | (uVar2 & 0x3ffff) << 8;
  uVar1 = in[0xb];
  out[0xd] = uVar2 >> 0x12;
  out[0xd] = uVar2 >> 0x12 | (uVar1 & 0xfff) << 0xe;
  out[0xe] = uVar1 >> 0xc;
  uVar2 = in[0xc];
  out[0xe] = uVar1 >> 0xc | (uVar2 & 0x3f) << 0x14;
  out[0xf] = uVar2 >> 6;
  return in + 0xd;
}

Assistant:

const uint32_t *__fastunpack26_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 10)) << (26 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 4)) << (26 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 26);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 24)) << (26 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 18)) << (26 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 12)) << (26 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 6)) << (26 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  out++;

  return in;
}